

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError ValidateParameters(PaStreamParameters *parameters,PaUtilHostApiRepresentation *hostApi,
                          StreamDirection mode)

{
  long *plVar1;
  PaAlsaDeviceInfo *pPVar2;
  bool bVar3;
  int local_48;
  PaAlsaStreamInfo *streamInfo;
  PaAlsaDeviceInfo *deviceInfo;
  PaError local_28;
  int maxChans;
  PaError result;
  StreamDirection mode_local;
  PaUtilHostApiRepresentation *hostApi_local;
  PaStreamParameters *parameters_local;
  
  local_28 = 0;
  if (parameters == (PaStreamParameters *)0x0) {
    __assert_fail("parameters",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x612,
                  "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                 );
  }
  if (parameters->device == -2) {
    plVar1 = (long *)parameters->hostApiSpecificStreamInfo;
    if (parameters->device == -2) {
      bVar3 = false;
      if (*plVar1 == 0x20) {
        bVar3 = plVar1[2] == 1;
      }
      if (bVar3) {
        if (plVar1[3] != 0) {
          return 0;
        }
        PaUtil_DebugPrint(
                         "Expression \'streamInfo->deviceString != NULL\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1569\n"
                         );
        local_28 = -0x270c;
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'streamInfo->size == sizeof (PaAlsaStreamInfo) && streamInfo->version == 1\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1568\n"
                         );
        local_28 = -0x2700;
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'parameters->device == paUseHostApiSpecificDeviceSpecification\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1566\n"
                       );
      local_28 = -0x270c;
    }
  }
  else {
    if ((hostApi->info).deviceCount <= parameters->device) {
      __assert_fail("parameters->device < hostApi->info.deviceCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x616,
                    "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                   );
    }
    if (parameters->hostApiSpecificStreamInfo == (void *)0x0) {
      pPVar2 = GetDeviceInfo(hostApi,parameters->device);
      if (pPVar2 == (PaAlsaDeviceInfo *)0x0) {
        __assert_fail("deviceInfo",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x627,
                      "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                     );
      }
      if (parameters->hostApiSpecificStreamInfo != (void *)0x0) {
        __assert_fail("parameters->hostApiSpecificStreamInfo == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x628,
                      "PaError ValidateParameters(const PaStreamParameters *, PaUtilHostApiRepresentation *, StreamDirection)"
                     );
      }
      if (mode == StreamDirection_In) {
        local_48 = (pPVar2->baseDeviceInfo).maxInputChannels;
      }
      else {
        local_48 = (pPVar2->baseDeviceInfo).maxOutputChannels;
      }
      if (local_48 < parameters->channelCount) {
        PaUtil_DebugPrint(
                         "Expression \'parameters->channelCount <= maxChans\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1579\n"
                         );
        local_28 = -0x270e;
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'parameters->hostApiSpecificStreamInfo == NULL\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1559\n"
                       );
      local_28 = -0x2709;
    }
  }
  return local_28;
}

Assistant:

static PaError ValidateParameters( const PaStreamParameters *parameters, PaUtilHostApiRepresentation *hostApi, StreamDirection mode )
{
    PaError result = paNoError;
    int maxChans;
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    assert( parameters );

    if( parameters->device != paUseHostApiSpecificDeviceSpecification )
    {
        assert( parameters->device < hostApi->info.deviceCount );
        PA_UNLESS( parameters->hostApiSpecificStreamInfo == NULL, paBadIODeviceCombination );
        deviceInfo = GetDeviceInfo( hostApi, parameters->device );
    }
    else
    {
        const PaAlsaStreamInfo *streamInfo = parameters->hostApiSpecificStreamInfo;

        PA_UNLESS( parameters->device == paUseHostApiSpecificDeviceSpecification, paInvalidDevice );
        PA_UNLESS( streamInfo->size == sizeof (PaAlsaStreamInfo) && streamInfo->version == 1,
                paIncompatibleHostApiSpecificStreamInfo );
        PA_UNLESS( streamInfo->deviceString != NULL, paInvalidDevice );

        /* Skip further checking */
        return paNoError;
    }

    assert( deviceInfo );
    assert( parameters->hostApiSpecificStreamInfo == NULL );
    maxChans = ( StreamDirection_In == mode ? deviceInfo->baseDeviceInfo.maxInputChannels :
        deviceInfo->baseDeviceInfo.maxOutputChannels );
    PA_UNLESS( parameters->channelCount <= maxChans, paInvalidChannelCount );

error:
    return result;
}